

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NDOLoader.cpp
# Opt level: O1

void __thiscall
Assimp::NDOImporter::InternReadFile
          (NDOImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer *ppEVar1;
  pointer *ppFVar2;
  pointer *ppVVar3;
  _Rb_tree_color _Var4;
  iterator __position;
  iterator __position_00;
  pointer pFVar5;
  iterator __position_01;
  pointer pVVar6;
  pointer pEVar7;
  bool bVar8;
  pointer paVar9;
  pointer __src;
  pointer puVar10;
  int8_t *piVar11;
  byte bVar12;
  char cVar13;
  uchar uVar14;
  unsigned_short uVar15;
  unsigned_short uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  undefined4 extraout_var;
  Logger *pLVar21;
  ulong uVar22;
  aiNode *paVar23;
  aiNode **__s;
  aiMesh **__s_00;
  aiNode *this_00;
  mapped_type_conflict3 *pmVar24;
  aiMesh *this_01;
  ulong *puVar25;
  aiFace *paVar26;
  uint *puVar27;
  undefined8 uVar28;
  aiVector3D *paVar29;
  runtime_error *this_02;
  Edge *edge;
  pointer paVar30;
  long lVar31;
  pointer pEVar32;
  uint uVar33;
  mapped_type_conflict3 mVar34;
  aiFace *paVar35;
  size_t __n;
  char *message;
  pointer pOVar36;
  float fVar37;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vertices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_> objects;
  StreamReaderBE reader;
  FaceTable face_table;
  ulong local_280;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_268;
  aiNode *local_250;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_248;
  aiScene *local_228;
  uint local_21c;
  undefined1 local_218 [32];
  pointer local_1f8;
  aiNode *local_1f0;
  aiVector3D **local_1e8;
  StreamReader<true,_false> local_1e0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined8 uStack_188;
  uint uStack_180;
  undefined4 uStack_17c;
  ios_base local_138 [264];
  
  local_228 = pScene;
  local_1a8._0_8_ = &local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"rb","");
  iVar17 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_1a8._0_8_);
  StreamReader<true,_false>::StreamReader
            (&local_1e0,(IOStream *)CONCAT44(extraout_var,iVar17),false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != &local_198) {
    operator_delete((void *)local_1a8._0_8_);
  }
  piVar11 = local_1e0.current;
  StreamReader<true,_false>::IncPtr(&local_1e0,9);
  iVar17 = strncmp("nendo ",piVar11,6);
  if (iVar17 != 0) {
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8._0_8_ = &local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Not a Nendo file; magic signature missing","");
    std::runtime_error::runtime_error(this_02,(string *)local_1a8);
    *(undefined ***)this_02 = &PTR__runtime_error_00900168;
    __cxa_throw(this_02,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  paVar30 = (pointer)(piVar11 + 6);
  iVar17 = strncmp("1.0",(char *)paVar30,3);
  if (iVar17 == 0) {
    pLVar21 = DefaultLogger::get();
    message = "NDO file format is 1.0";
  }
  else {
    iVar18 = strncmp("1.1",(char *)paVar30,3);
    if (iVar18 != 0) {
      iVar18 = strncmp("1.2",(char *)paVar30,3);
      if (iVar18 == 0) {
        pLVar21 = DefaultLogger::get();
        bVar8 = true;
        Logger::info(pLVar21,"NDO file format is 1.2");
      }
      else {
        pLVar21 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[65]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [65])
                    "Unrecognized nendo file format version, continuing happily ... :");
        local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_start = paVar30;
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
                   (char **)&local_268);
        std::__cxx11::stringbuf::str();
        Logger::warn(pLVar21,(char *)local_218._0_8_);
        if ((pointer)local_218._0_8_ != (pointer)(local_218 + 0x10)) {
          operator_delete((void *)local_218._0_8_);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar8 = true;
      }
      goto LAB_0045b129;
    }
    pLVar21 = DefaultLogger::get();
    message = "NDO file format is 1.1";
  }
  Logger::info(pLVar21,message);
  bVar8 = false;
LAB_0045b129:
  StreamReader<true,_false>::IncPtr(&local_1e0,2);
  if (bVar8) {
    StreamReader<true,_false>::IncPtr(&local_1e0,2);
  }
  bVar12 = StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
  std::vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>::vector
            ((vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_> *)
             local_218,(ulong)bVar12,(allocator_type *)local_1a8);
  if (local_218._8_8_ != local_218._0_8_) {
    local_280 = 0;
    do {
      cVar13 = StreamReader<true,_false>::Get<signed_char>(&local_1e0);
      if (cVar13 != '\0') {
        pOVar36 = (pointer)(local_218._0_8_ + local_280 * 0x68);
        if (bVar8) {
          uVar19 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar15 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar19 = (uint)uVar15;
        }
        piVar11 = local_1e0.current;
        StreamReader<true,_false>::IncPtr(&local_1e0,(ulong)(uVar19 + 0x4c));
        local_1a8._0_8_ = &local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,piVar11,piVar11 + uVar19);
        std::__cxx11::string::operator=((string *)pOVar36,(string *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_);
        }
        if (bVar8) {
          uVar19 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar15 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar19 = (uint)uVar15;
        }
        local_250 = (aiNode *)&pOVar36->edges;
        std::vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>::reserve
                  ((vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_> *)
                   local_250,(ulong)uVar19);
        if (uVar19 != 0) {
          uVar33 = 0;
          do {
            uStack_188._0_4_ = 0;
            uStack_188._4_1_ = '\0';
            uStack_188._5_1_ = '\0';
            uStack_188._6_1_ = '\0';
            uStack_188._7_1_ = '\0';
            uStack_180 = 0;
            local_198._M_allocated_capacity = 0;
            local_198._8_4_ = 0;
            local_198._12_4_ = 0;
            local_1a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_1a8._8_8_ = 0;
            __position._M_current =
                 (pOVar36->edges).
                 super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (pOVar36->edges).
                super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>::
              _M_realloc_insert<Assimp::NDOImporter::Edge>
                        ((vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                          *)local_250,__position,(Edge *)local_1a8);
            }
            else {
              *(undefined8 *)((__position._M_current)->edge + 7) = 0;
              (__position._M_current)->color[0] = '\0';
              (__position._M_current)->color[1] = '\0';
              (__position._M_current)->color[2] = '\0';
              (__position._M_current)->color[3] = '\0';
              (__position._M_current)->color[4] = '\0';
              (__position._M_current)->color[5] = '\0';
              (__position._M_current)->color[6] = '\0';
              (__position._M_current)->color[7] = '\0';
              (__position._M_current)->edge[4] = 0;
              (__position._M_current)->edge[5] = 0;
              (__position._M_current)->edge[6] = 0;
              (__position._M_current)->edge[7] = 0;
              (__position._M_current)->edge[0] = 0;
              (__position._M_current)->edge[1] = 0;
              (__position._M_current)->edge[2] = 0;
              (__position._M_current)->edge[3] = 0;
              ppEVar1 = &(pOVar36->edges).
                         super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppEVar1 = *ppEVar1 + 1;
            }
            pEVar32 = (pOVar36->edges).
                      super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            lVar31 = -0xb;
            do {
              if (bVar8) {
                uVar20 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
              }
              else {
                uVar15 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
                uVar20 = (uint)uVar15;
              }
              pEVar32->edge[lVar31] = uVar20;
              lVar31 = lVar31 + 1;
            } while (lVar31 != -3);
            if (iVar17 == 0) {
              uVar20 = 0;
            }
            else {
              bVar12 = StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              uVar20 = (uint)bVar12;
            }
            pEVar32[-1].hard = uVar20;
            lVar31 = -8;
            do {
              uVar14 = StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              *(uchar *)((long)pEVar32->edge + lVar31) = uVar14;
              lVar31 = lVar31 + 1;
            } while (lVar31 != 0);
            uVar33 = uVar33 + 1;
          } while (uVar33 != uVar19);
        }
        if (bVar8) {
          uVar19 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar15 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar19 = (uint)uVar15;
        }
        std::vector<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>::reserve
                  (&pOVar36->faces,(ulong)uVar19);
        for (; uVar19 != 0; uVar19 = uVar19 - 1) {
          local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffff00000000;
          __position_00._M_current =
               (pOVar36->faces).
               super__Vector_base<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position_00._M_current ==
              (pOVar36->faces).
              super__Vector_base<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>::
            _M_realloc_insert<Assimp::NDOImporter::Face>
                      (&pOVar36->faces,__position_00,(Face *)local_1a8);
          }
          else {
            (__position_00._M_current)->elem = 0;
            ppFVar2 = &(pOVar36->faces).
                       super__Vector_base<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppFVar2 = *ppFVar2 + 1;
          }
          pFVar5 = (pOVar36->faces).
                   super__Vector_base<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (bVar8) {
            uVar33 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
          }
          else {
            uVar15 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
            uVar33 = (uint)uVar15;
          }
          pFVar5[-1].elem = uVar33;
        }
        if (bVar8) {
          uVar19 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar15 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar19 = (uint)uVar15;
        }
        std::vector<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>::
        reserve(&pOVar36->vertices,(ulong)uVar19);
        for (; uVar19 != 0; uVar19 = uVar19 - 1) {
          local_1a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_1a8._8_8_ = 0;
          __position_01._M_current =
               (pOVar36->vertices).
               super__Vector_base<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position_01._M_current ==
              (pOVar36->vertices).
              super__Vector_base<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>::
            _M_realloc_insert<Assimp::NDOImporter::Vertex>
                      (&pOVar36->vertices,__position_01,(Vertex *)local_1a8);
          }
          else {
            (__position_01._M_current)->num = 0;
            ((__position_01._M_current)->val).x = 0.0;
            ((__position_01._M_current)->val).y = 0.0;
            ((__position_01._M_current)->val).z = 0.0;
            ppVVar3 = &(pOVar36->vertices).
                       super__Vector_base<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppVVar3 = *ppVVar3 + 1;
          }
          pVVar6 = (pOVar36->vertices).
                   super__Vector_base<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (bVar8) {
            uVar33 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
          }
          else {
            uVar15 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
            uVar33 = (uint)uVar15;
          }
          pVVar6[-1].num = uVar33;
          fVar37 = StreamReader<true,_false>::Get<float>(&local_1e0);
          pVVar6[-1].val.x = fVar37;
          fVar37 = StreamReader<true,_false>::Get<float>(&local_1e0);
          pVVar6[-1].val.y = fVar37;
          fVar37 = StreamReader<true,_false>::Get<float>(&local_1e0);
          pVVar6[-1].val.z = fVar37;
        }
        if (bVar8) {
          uVar19 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar15 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar19 = (uint)uVar15;
        }
        for (; uVar19 != 0; uVar19 = uVar19 - 1) {
          if (bVar8) {
            StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
          }
          else {
            StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          }
        }
        if (bVar8) {
          uVar19 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar15 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar19 = (uint)uVar15;
        }
        for (; uVar19 != 0; uVar19 = uVar19 - 1) {
          if (bVar8) {
            StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
          }
          else {
            StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          }
        }
        uVar14 = StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
        if (uVar14 != '\0') {
          uVar15 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar16 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          if ((uint)uVar16 * (uint)uVar15 != 0) {
            uVar19 = 0;
            do {
              bVar12 = StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              uVar19 = uVar19 + bVar12;
            } while (uVar19 < (uint)uVar16 * (uint)uVar15);
          }
        }
      }
      local_280 = (ulong)((int)local_280 + 1);
      uVar22 = ((long)(local_218._8_8_ - local_218._0_8_) >> 3) * 0x4ec4ec4ec4ec4ec5;
    } while (local_280 <= uVar22 && uVar22 - local_280 != 0);
  }
  paVar23 = (aiNode *)operator_new(0x478);
  local_1a8._0_8_ = &local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"$NDODummyRoot","");
  aiNode::aiNode(paVar23,(string *)local_1a8);
  local_228->mRootNode = paVar23;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != &local_198) {
    operator_delete((void *)local_1a8._0_8_);
  }
  local_1f8 = (pointer)local_218._8_8_;
  lVar31 = (long)(local_218._8_8_ - local_218._0_8_) >> 3;
  uVar22 = lVar31 * 0x4ec4ec4ec4ec4ec5;
  paVar23->mNumChildren = (uint)uVar22;
  uVar22 = (uVar22 & 0xffffffff) << 3;
  __s = (aiNode **)operator_new__(uVar22);
  memset(__s,0,uVar22);
  paVar23->mChildren = __s;
  uVar22 = lVar31 * 0x7627627627627628 & 0x7fffffff8;
  __s_00 = (aiMesh **)operator_new__(uVar22);
  memset(__s_00,0,uVar22);
  local_228->mMeshes = __s_00;
  local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  pOVar36 = (pointer)local_218._0_8_;
  if ((pointer)local_218._0_8_ != local_1f8) {
    do {
      local_1f0 = paVar23;
      paVar23 = local_1f0;
      this_00 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_00,&pOVar36->name);
      *__s = this_00;
      this_00->mParent = paVar23;
      local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
      local_198._M_allocated_capacity = 0;
      local_198._8_8_ = local_1a8 + 8;
      uStack_180 = 0;
      uStack_17c = 0;
      pEVar32 = (pOVar36->edges).
                super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pEVar7 = (pOVar36->edges).
               super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_250 = this_00;
      uStack_188 = (_Rb_tree_node_base *)local_198._8_8_;
      if (pEVar32 != pEVar7) {
        mVar34 = 0;
        do {
          pmVar24 = std::
                    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                  *)local_1a8,pEVar32->edge + 2);
          *pmVar24 = mVar34;
          pmVar24 = std::
                    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                  *)local_1a8,pEVar32->edge + 3);
          *pmVar24 = mVar34;
          mVar34 = mVar34 + 1;
          pEVar32 = pEVar32 + 1;
        } while (pEVar32 != pEVar7);
      }
      this_01 = (aiMesh *)operator_new(0x520);
      this_01->mPrimitiveTypes = 0;
      this_01->mNumVertices = 0;
      this_01->mNumFaces = 0;
      local_1e8 = &this_01->mVertices;
      memset(local_1e8,0,0xcc);
      this_01->mBones = (aiBone **)0x0;
      this_01->mMaterialIndex = 0;
      (this_01->mName).length = 0;
      (this_01->mName).data[0] = '\0';
      memset((this_01->mName).data + 1,0x1b,0x3ff);
      uVar19 = uStack_180;
      this_01->mNumAnimMeshes = 0;
      this_01->mAnimMeshes = (aiAnimMesh **)0x0;
      this_01->mMethod = 0;
      (this_01->mAABB).mMin.x = 0.0;
      (this_01->mAABB).mMin.y = 0.0;
      (this_01->mAABB).mMin.z = 0.0;
      (this_01->mAABB).mMax.x = 0.0;
      (this_01->mAABB).mMax.y = 0.0;
      (this_01->mAABB).mMax.z = 0.0;
      this_01->mTextureCoords[0] = (aiVector3D *)0x0;
      this_01->mTextureCoords[1] = (aiVector3D *)0x0;
      this_01->mTextureCoords[2] = (aiVector3D *)0x0;
      this_01->mTextureCoords[3] = (aiVector3D *)0x0;
      this_01->mTextureCoords[4] = (aiVector3D *)0x0;
      this_01->mTextureCoords[5] = (aiVector3D *)0x0;
      this_01->mTextureCoords[6] = (aiVector3D *)0x0;
      this_01->mTextureCoords[7] = (aiVector3D *)0x0;
      this_01->mNumUVComponents[0] = 0;
      this_01->mNumUVComponents[1] = 0;
      this_01->mNumUVComponents[2] = 0;
      this_01->mNumUVComponents[3] = 0;
      this_01->mNumUVComponents[4] = 0;
      this_01->mNumUVComponents[5] = 0;
      this_01->mNumUVComponents[6] = 0;
      this_01->mNumUVComponents[7] = 0;
      this_01->mColors[0] = (aiColor4D *)0x0;
      this_01->mColors[1] = (aiColor4D *)0x0;
      this_01->mColors[2] = (aiColor4D *)0x0;
      this_01->mColors[3] = (aiColor4D *)0x0;
      this_01->mColors[4] = (aiColor4D *)0x0;
      this_01->mColors[5] = (aiColor4D *)0x0;
      this_01->mColors[6] = (aiColor4D *)0x0;
      this_01->mColors[7] = (aiColor4D *)0x0;
      lVar31 = CONCAT44(uStack_17c,uStack_180);
      this_01->mNumFaces = uStack_180;
      uVar22 = (ulong)uStack_180;
      puVar25 = (ulong *)operator_new__(uVar22 * 0x10 + 8);
      *puVar25 = uVar22;
      paVar35 = (aiFace *)(puVar25 + 1);
      if (uVar19 != 0) {
        paVar26 = paVar35;
        do {
          paVar26->mNumIndices = 0;
          paVar26->mIndices = (uint *)0x0;
          paVar26 = paVar26 + 1;
        } while (paVar26 != paVar35 + uVar22);
      }
      this_01->mFaces = paVar35;
      if (local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish =
             local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                (&local_268,lVar31 << 2);
      uVar28 = local_198._8_8_;
      while (paVar9 = local_268.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish,
            paVar30 = local_268.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start,
            (_Rb_tree_node_base *)uVar28 != (_Rb_tree_node_base *)(local_1a8 + 8)) {
        if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        _Var4 = ((_Rb_tree_node_base *)(uVar28 + 0x20))->_M_color;
        uVar19 = *(uint *)&((_Rb_tree_node_base *)(uVar28 + 0x20))->field_0x4;
        do {
          pEVar32 = (pOVar36->edges).
                    super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar22 = (ulong)(_Var4 == pEVar32[uVar19].edge[3]);
          uVar33 = pEVar32[uVar19].edge[uVar22];
          uVar19 = pEVar32[uVar19].edge[uVar22 + 4];
          local_21c = (int)((ulong)((long)local_268.
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_268.
                                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                      -0x55555555;
          if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_248,
                       (iterator)
                       local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_21c);
          }
          else {
            *local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_21c;
            local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          pVVar6 = (pOVar36->vertices).
                   super__Vector_base<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          paVar29 = &pVVar6[uVar33].val;
          if (local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>const&>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_268,
                       (iterator)
                       local_268.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish,paVar29);
          }
          else {
            (local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->z = pVVar6[uVar33].val.z;
            fVar37 = paVar29->y;
            (local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->x = paVar29->x;
            (local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->y = fVar37;
            local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_268.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          puVar10 = local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          __src = local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        } while (uVar19 != *(uint *)&((_Rb_tree_node_base *)(uVar28 + 0x20))->field_0x4);
        uVar22 = (long)local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        paVar35->mNumIndices = (uint)(uVar22 >> 2);
        puVar27 = (uint *)operator_new__(uVar22 & 0x3fffffffc);
        paVar35->mIndices = puVar27;
        if (puVar10 != __src) {
          memmove(puVar27,__src,uVar22);
        }
        uVar28 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar28);
        paVar35 = paVar35 + 1;
      }
      __n = (long)local_268.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_268.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start;
      uVar22 = (long)__n / 0xc;
      this_01->mNumVertices = (uint)uVar22;
      uVar22 = uVar22 & 0xffffffff;
      paVar29 = (aiVector3D *)operator_new__(uVar22 * 0xc);
      if (uVar22 != 0) {
        memset(paVar29,0,((uVar22 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      *local_1e8 = paVar29;
      if (paVar9 != paVar30) {
        memmove(paVar29,paVar30,__n);
      }
      if (this_01->mNumVertices == 0) {
        aiMesh::~aiMesh(this_01);
        operator_delete(this_01);
      }
      else {
        local_228->mMeshes[local_228->mNumMeshes] = this_01;
        uVar19 = local_228->mNumMeshes;
        local_228->mNumMeshes = uVar19 + 1;
        local_250->mNumMeshes = 1;
        puVar27 = (uint *)operator_new__(4);
        local_250->mMeshes = puVar27;
        *puVar27 = uVar19;
      }
      __s = __s + 1;
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)local_1a8);
      pOVar36 = pOVar36 + 1;
      paVar23 = local_1f0;
    } while (pOVar36 != local_1f8);
  }
  if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
    operator_delete(local_268.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>::~vector
            ((vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_> *)
             local_218);
  StreamReader<true,_false>::~StreamReader(&local_1e0);
  return;
}

Assistant:

void NDOImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    StreamReaderBE reader(pIOHandler->Open( pFile, "rb"));

    // first 9 bytes are nendo file format ("nendo 1.n")
    const char* head = (const char*)reader.GetPtr();
    reader.IncPtr(9);

    if (strncmp("nendo ",head,6)) {
        throw DeadlyImportError("Not a Nendo file; magic signature missing");
    }
    // check if this is a supported version. if not, continue, too -- users,
    // please don't complain if it doesn't work then ...
    unsigned int file_format = 12;
    if (!strncmp("1.0",head+6,3)) {
        file_format = 10;
        ASSIMP_LOG_INFO("NDO file format is 1.0");
    }
    else if (!strncmp("1.1",head+6,3)) {
        file_format = 11;
        ASSIMP_LOG_INFO("NDO file format is 1.1");
    }
    else if (!strncmp("1.2",head+6,3)) {
        file_format = 12;
        ASSIMP_LOG_INFO("NDO file format is 1.2");
    }
    else {
        ASSIMP_LOG_WARN_F( "Unrecognized nendo file format version, continuing happily ... :", (head+6));
    }

    reader.IncPtr(2); /* skip flags */
    if (file_format >= 12) {
        reader.IncPtr(2);
    }
    unsigned int temp = reader.GetU1();

    std::vector<Object> objects(temp); /* buffer to store all the loaded objects in */

    // read all objects
    for (unsigned int o = 0; o < objects.size(); ++o) {

//      if (file_format < 12) {
            if (!reader.GetI1()) {
                continue; /* skip over empty object */
            }
        //  reader.GetI2();
//      }
        Object& obj = objects[o];

        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        head = (const char*)reader.GetPtr();
        reader.IncPtr(temp + 76); /* skip unknown stuff */

        obj.name = std::string(head, temp);

        // read edge table
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        obj.edges.reserve(temp);
        for (unsigned int e = 0; e < temp; ++e) {

            obj.edges.push_back(Edge());
            Edge& edge = obj.edges.back();

            for (unsigned int i = 0; i< 8; ++i) {
                edge.edge[i] = file_format >= 12 ? reader.GetU4() : reader.GetU2();
            }
            edge.hard =  file_format >= 11 ? reader.GetU1() : 0;
            for (unsigned int i = 0; i< 8; ++i) {
                edge.color[i] = reader.GetU1();
            }
        }

        // read face table
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        obj.faces.reserve(temp);
        for (unsigned int e = 0; e < temp; ++e) {

            obj.faces.push_back(Face());
            Face& face = obj.faces.back();

            face.elem = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        }

        // read vertex table
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        obj.vertices.reserve(temp);
        for (unsigned int e = 0; e < temp; ++e) {

            obj.vertices.push_back(Vertex());
            Vertex& v = obj.vertices.back();

            v.num = file_format >= 12 ? reader.GetU4() : reader.GetU2();
            v.val.x = reader.GetF4();
            v.val.y = reader.GetF4();
            v.val.z = reader.GetF4();
        }

        // read UVs
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        for (unsigned int e = 0; e < temp; ++e) {
             file_format >= 12 ? reader.GetU4() : reader.GetU2();
        }

        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        for (unsigned int e = 0; e < temp; ++e) {
             file_format >= 12 ? reader.GetU4() : reader.GetU2();
        }

        if (reader.GetU1()) {
            const unsigned int x = reader.GetU2(), y = reader.GetU2();
            temp = 0;
            while (temp < x*y)  {
                unsigned int repeat = reader.GetU1();
                reader.GetU1();
                reader.GetU1();
                reader.GetU1();
                temp += repeat;
            }
        }
    }

    // construct a dummy node graph and add all named objects as child nodes
    aiNode* root = pScene->mRootNode = new aiNode("$NDODummyRoot");
    aiNode** cc = root->mChildren = new aiNode* [ root->mNumChildren = static_cast<unsigned int>( objects.size()) ] ();
    pScene->mMeshes = new aiMesh* [ root->mNumChildren] ();

    std::vector<aiVector3D> vertices;
    std::vector<unsigned int> indices;

    for(const Object& obj : objects) {
        aiNode* nd = *cc++ = new aiNode(obj.name);
        nd->mParent = root;

        // translated from a python dict() - a vector might be sufficient as well
        typedef std::map<unsigned int, unsigned int>  FaceTable;
        FaceTable face_table;

        unsigned int n = 0;
        for(const Edge& edge : obj.edges) {

            face_table[edge.edge[2]] = n;
            face_table[edge.edge[3]] = n;

            ++n;
        }

        aiMesh* mesh = new aiMesh();
        mesh->mNumFaces=static_cast<unsigned int>(face_table.size());
        aiFace* faces = mesh->mFaces = new aiFace[mesh->mNumFaces];

        vertices.clear();
        vertices.reserve(4 * face_table.size()); // arbitrarily chosen
        for(FaceTable::value_type& v : face_table) {
            indices.clear();

            aiFace& f = *faces++;

            const unsigned int key = v.first;
            unsigned int cur_edge = v.second;
            while (1) {
                unsigned int next_edge, next_vert;
                if (key == obj.edges[cur_edge].edge[3]) {
                    next_edge = obj.edges[cur_edge].edge[5];
                    next_vert = obj.edges[cur_edge].edge[1];
                }
                else {
                    next_edge = obj.edges[cur_edge].edge[4];
                    next_vert = obj.edges[cur_edge].edge[0];
                }
                indices.push_back( static_cast<unsigned int>(vertices.size()) );
                vertices.push_back(obj.vertices[ next_vert ].val);

                cur_edge = next_edge;
                if (cur_edge == v.second) {
                    break;
                }
            }

            f.mIndices = new unsigned int[f.mNumIndices = static_cast<unsigned int>(indices.size())];
            std::copy(indices.begin(),indices.end(),f.mIndices);
        }

        mesh->mVertices = new aiVector3D[mesh->mNumVertices = static_cast<unsigned int>(vertices.size())];
        std::copy(vertices.begin(),vertices.end(),mesh->mVertices);

        if (mesh->mNumVertices) {
            pScene->mMeshes[pScene->mNumMeshes] = mesh;

            (nd->mMeshes = new unsigned int[nd->mNumMeshes=1])[0]=pScene->mNumMeshes++;
        }else
            delete mesh;
    }
}